

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-bson.c
# Opt level: O2

void pack_dict(lua_State *L,bson *b,_Bool isarray)

{
  int iVar1;
  uint uVar2;
  lua_Integer lVar3;
  char *pcVar4;
  int idx;
  char *pcVar5;
  size_t sz;
  int local_5c;
  char numberkey [32];
  
  local_5c = reserve_length(b);
  lua_pushnil(L);
  do {
    idx = -2;
    iVar1 = lua_next(L,-2);
    if (iVar1 == 0) {
      write_byte(b,'\0');
      write_length(b,b->size - local_5c,local_5c);
      return;
    }
    iVar1 = lua_type(L,-2);
    if (isarray) {
      if (iVar1 != 3) {
        pcVar5 = "Invalid array key type : %s";
LAB_001187b0:
        pcVar4 = lua_typename(L,iVar1);
        luaL_error(L,pcVar5,pcVar4);
        return;
      }
      lVar3 = lua_tointegerx(L,-2,(int *)0x0);
      uVar2 = (int)lVar3 - 1;
      if (uVar2 < 0x400) {
        numberkey._0_4_ = bson_numstrs[uVar2];
        iVar1 = bson_numstr_len[uVar2];
      }
      else {
        iVar1 = sprintf(numberkey,"%u",(ulong)uVar2);
      }
      sz = (size_t)iVar1;
      pcVar5 = numberkey;
LAB_0011876e:
      append_one(b,L,pcVar5,sz);
    }
    else {
      if (iVar1 == 4) {
        pcVar5 = lua_tolstring(L,-2,&sz);
        goto LAB_0011876e;
      }
      if (iVar1 != 3) {
        pcVar5 = "Invalid key type : %s";
        goto LAB_001187b0;
      }
      lua_pushvalue(L,-2);
      lua_rotate(L,-2,1);
      pcVar5 = lua_tolstring(L,-2,&sz);
      append_one(b,L,pcVar5,sz);
      idx = -3;
    }
    lua_settop(L,idx);
  } while( true );
}

Assistant:

static void
pack_dict(lua_State *L, struct bson *b, bool isarray) {
	int length = reserve_length(b);
	lua_pushnil(L);
	while(lua_next(L,-2) != 0) {
		int kt = lua_type(L, -2);
		char numberkey[32];
		const char * key = NULL;
		size_t sz;
		if (isarray) {
			if (kt != LUA_TNUMBER) {
				luaL_error(L, "Invalid array key type : %s", lua_typename(L, kt));
				return;
			}
			sz = bson_numstr(numberkey, (unsigned int)lua_tointeger(L,-2)-1);
			key = numberkey;

			append_one(b, L, key, sz);
			lua_pop(L,1);
		} else {
			switch(kt) {
			case LUA_TNUMBER:
				// copy key, don't change key type
				lua_pushvalue(L,-2);
				lua_insert(L,-2);
				key = lua_tolstring(L,-2,&sz);
				append_one(b, L, key, sz);
				lua_pop(L,2);
				break;
			case LUA_TSTRING:
				key = lua_tolstring(L,-2,&sz);
				append_one(b, L, key, sz);
				lua_pop(L,1);
				break;
			default:
				luaL_error(L, "Invalid key type : %s", lua_typename(L, kt));
				return;
			}
		}
	}
	write_byte(b,0);
	write_length(b, b->size - length, length);
}